

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O3

id_type __thiscall
Darts::Details::DawgBuilder::find_node(DawgBuilder *this,id_type node_id,id_type *hash_id)

{
  int *piVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  
  uVar10 = 0;
  if (node_id != 0) {
    uVar12 = node_id;
    do {
      piVar1 = (int *)((this->nodes_).buf_.array_ + (ulong)uVar12 * 0xc);
      if (*(byte *)(piVar1 + 2) == 0) {
        uVar12 = *piVar1 * 2;
      }
      else {
        uVar12 = *piVar1 * 4 + (uint)*(byte *)((long)piVar1 + 9) * 2;
      }
      uVar12 = *(byte *)((long)piVar1 + 10) | uVar12;
      uVar12 = uVar12 * 0x8000 + ~((uint)*(byte *)(piVar1 + 2) << 0x18 ^ uVar12);
      uVar12 = (uVar12 >> 0xc ^ uVar12) * 5;
      uVar12 = (uVar12 >> 4 ^ uVar12) * 0x809;
      uVar9 = uVar12 >> 0x10 ^ (uint)uVar10 ^ uVar12;
      uVar10 = (ulong)uVar9;
      uVar12 = piVar1[1];
    } while (uVar12 != 0);
    uVar10 = (ulong)uVar9;
  }
  pcVar2 = (this->table_).buf_.array_;
  uVar3 = (this->table_).size_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar3;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar10;
  lVar11 = SUB168(auVar8 % auVar6,0);
  *hash_id = SUB164(auVar8 % auVar6,0);
  uVar12 = *(uint *)(pcVar2 + lVar11 * 4);
  if (uVar12 != 0) {
    pcVar4 = (this->nodes_).buf_.array_;
    pcVar5 = (this->units_).buf_.array_;
    do {
      uVar9 = *(uint *)(pcVar4 + (ulong)node_id * 0xc + 4);
      uVar10 = (ulong)uVar12;
      if (uVar9 != 0) {
        uVar10 = (ulong)uVar12;
        do {
          if ((pcVar5[uVar10 * 4] & 1U) == 0) goto LAB_001f05f5;
          uVar10 = (ulong)((int)uVar10 + 1);
          uVar9 = *(uint *)(pcVar4 + (ulong)uVar9 * 0xc + 4);
        } while (uVar9 != 0);
      }
      if ((pcVar5[uVar10 * 4] & 1U) == 0) {
        if (node_id == 0) {
          return uVar12;
        }
        uVar9 = node_id;
        while( true ) {
          piVar1 = (int *)(pcVar4 + (ulong)uVar9 * 0xc);
          if ((char)piVar1[2] == '\0') {
            uVar9 = *piVar1 * 2;
          }
          else {
            uVar9 = *piVar1 * 4 + (uint)*(byte *)((long)piVar1 + 9) * 2;
          }
          if (((*(byte *)((long)piVar1 + 10) | uVar9) != *(uint *)(pcVar5 + uVar10 * 4)) ||
             ((char)piVar1[2] != (this->labels_).buf_.array_[uVar10])) break;
          uVar9 = piVar1[1];
          uVar10 = (ulong)((int)uVar10 - 1);
          if (uVar9 == 0) {
            return uVar12;
          }
        }
      }
LAB_001f05f5:
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar3;
      auVar7 = ZEXT416((int)lVar11 + 1) % auVar7;
      lVar11 = auVar7._0_8_;
      *hash_id = auVar7._0_4_;
      uVar12 = *(uint *)(pcVar2 + lVar11 * 4);
    } while (uVar12 != 0);
  }
  return 0;
}

Assistant:

inline id_type DawgBuilder::find_node(id_type node_id,
    id_type *hash_id) const {
  *hash_id = hash_node(node_id) % table_.size();
  for ( ; ; *hash_id = (*hash_id + 1) % table_.size()) {
    id_type unit_id = table_[*hash_id];
    if (unit_id == 0) {
      break;
    }

    if (are_equal(node_id, unit_id)) {
      return unit_id;
    }
  }
  return 0;
}